

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  int baud;
  RobotModel model;
  string port;
  Create robot;
  allocator local_1bd;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  long local_1a8;
  char *local_1a0 [2];
  char local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [320];
  
  local_1a8 = ___cxa_end_catch;
  local_1b8 = CONCAT44(create::RobotModel::CREATE_2._4_4_,(undefined4)create::RobotModel::CREATE_2);
  uStack_1b0 = CONCAT44(uRam00000000001080ec,_Init);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"/dev/ttyUSB0","");
  local_1bc = 0x1c200;
  pcVar5 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)local_180,argv[1],&local_1bd);
    iVar2 = std::__cxx11::string::compare((char *)local_180);
    if (local_180[0] != local_170) {
      operator_delete(local_180[0]);
    }
    if (iVar2 == 0) {
      local_1a8 = std::cout;
      local_1b8 = create::RobotModel::CREATE_1;
      uStack_1b0 = ___ostream_insert<char,std::char_traits<char>>;
      local_1bc = 0xe100;
      pcVar5 = "Running driver for Create 1";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  create::Create::Create((Create *)local_180,1);
  cVar1 = create::Create::connect((string *)local_180,(int *)local_1a0);
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to connect to robot on port ",0x23);
    pcVar5 = local_1a0[0];
    if (local_1a0[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080c8);
    }
    else {
      sVar3 = strlen(local_1a0[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    create::Create::~Create((Create *)local_180);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    return 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Connected to robot",0x12);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  do {
    create::Create::getTotalPackets();
    create::Create::getNumCorruptPackets();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\rTotal packets: ",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Corrupt packets: ",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    usleep(100000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  while (true) {
    // Get serial packet statistics
    const uint64_t total_packets = robot.getTotalPackets();
    const uint64_t num_corrupt_packets = robot.getNumCorruptPackets();

    // Print packet stats 
    std::cout << "\rTotal packets: " << total_packets << "  Corrupt packets: " << num_corrupt_packets;

    usleep(100000);  // 10 Hz
  }

  return 0;
}